

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rips_persistence.cpp
# Opt level: O0

void program_options(int argc,char **argv,string *off_file_points,string *filediag,
                    Filtration_value *threshold,int *dim_max,int *p,
                    Filtration_value *min_persistence)

{
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar1;
  char *pcVar2;
  typed_value<float,_char> *ptVar3;
  typed_value<int,_char> *ptVar4;
  options_description *poVar5;
  basic_command_line_parser<char> *pbVar6;
  size_type sVar7;
  ostream *poVar8;
  void *pvVar9;
  bool bVar10;
  allocator<char> local_419;
  key_type local_418;
  allocator<char> local_3f1;
  key_type local_3f0;
  basic_command_line_parser<char> local_3d0;
  basic_parsed_options<char> local_358;
  variables_map local_330 [8];
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_320 [144];
  options_description local_290 [8];
  options_description all;
  positional_options_description local_210 [8];
  positional_options_description pos;
  int local_1d4 [2];
  float local_1cc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined8 local_1a8;
  allocator<char> local_199;
  string local_198 [32];
  options_description local_178 [8];
  options_description visible;
  undefined8 local_f8 [3];
  allocator<char> local_d9;
  string local_d8 [32];
  options_description local_b8 [8];
  options_description hidden;
  int *dim_max_local;
  Filtration_value *threshold_local;
  string *filediag_local;
  string *off_file_points_local;
  char **argv_local;
  int argc_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"Hidden options",&local_d9);
  boost::program_options::options_description::options_description
            (local_b8,local_d8,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  local_f8[0] = boost::program_options::options_description::add_options();
  ptVar1 = boost::program_options::value<std::__cxx11::string>(off_file_points);
  boost::program_options::options_description_easy_init::operator()
            ((char *)local_f8,(value_semantic *)0x162455,(char *)ptVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_198,"Allowed options",&local_199);
  boost::program_options::options_description::options_description
            (local_178,local_198,100,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator(&local_199);
  local_1a8 = boost::program_options::options_description::add_options();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&local_1a8,"help,h");
  ptVar1 = boost::program_options::value<std::__cxx11::string>(filediag);
  std::__cxx11::string::string((string *)&local_1c8);
  ptVar1 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar1,&local_1c8);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"output-file,o",(char *)ptVar1);
  ptVar3 = boost::program_options::value<float>(threshold);
  local_1cc = std::numeric_limits<float>::infinity();
  ptVar3 = boost::program_options::typed_value<float,_char>::default_value(ptVar3,&local_1cc);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"max-edge-length,r",(char *)ptVar3);
  ptVar4 = boost::program_options::value<int>(dim_max);
  local_1d4[1] = 1;
  ptVar4 = boost::program_options::typed_value<int,_char>::default_value(ptVar4,local_1d4 + 1);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"cpx-dimension,d",(char *)ptVar4);
  ptVar4 = boost::program_options::value<int>(p);
  local_1d4[0] = 0xb;
  ptVar4 = boost::program_options::typed_value<int,_char>::default_value(ptVar4,local_1d4);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"field-charac,p",(char *)ptVar4);
  ptVar3 = boost::program_options::value<float>(min_persistence);
  boost::program_options::options_description_easy_init::operator()
            (pcVar2,(value_semantic *)"min-persistence,m",(char *)ptVar3);
  std::__cxx11::string::~string((string *)&local_1c8);
  boost::program_options::positional_options_description::positional_options_description(local_210);
  boost::program_options::positional_options_description::add((char *)local_210,0x162455);
  boost::program_options::options_description::options_description
            (local_290,(uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  poVar5 = (options_description *)boost::program_options::options_description::add(local_290);
  boost::program_options::options_description::add(poVar5);
  boost::program_options::variables_map::variables_map(local_330);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            (&local_3d0,argc,argv);
  pbVar6 = boost::program_options::basic_command_line_parser<char>::options(&local_3d0,local_290);
  pbVar6 = boost::program_options::basic_command_line_parser<char>::positional(pbVar6,local_210);
  boost::program_options::basic_command_line_parser<char>::run(&local_358,pbVar6);
  boost::program_options::store((basic_parsed_options *)&local_358,local_330,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options(&local_358);
  boost::program_options::basic_command_line_parser<char>::~basic_command_line_parser(&local_3d0);
  boost::program_options::notify(local_330);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"help",&local_3f1);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_320,&local_3f0);
  bVar10 = true;
  if (sVar7 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"input-file",&local_419)
    ;
    sVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_320,&local_418);
    bVar10 = sVar7 == 0;
    std::__cxx11::string::~string((string *)&local_418);
    std::allocator<char>::~allocator(&local_419);
  }
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  if (!bVar10) {
    boost::program_options::variables_map::~variables_map(local_330);
    boost::program_options::options_description::~options_description(local_290);
    boost::program_options::positional_options_description::~positional_options_description
              (local_210);
    boost::program_options::options_description::~options_description(local_178);
    boost::program_options::options_description::~options_description(local_b8);
    return;
  }
  std::ostream::operator<<(&std::clog,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::clog,
                  "Compute the persistent homology with coefficient field Z/pZ \n");
  std::operator<<((ostream *)&std::clog,"of a Rips complex defined on a set of input points.\n \n");
  std::operator<<((ostream *)&std::clog,
                  "The output diagram contains one bar per line, written with the convention: \n");
  std::operator<<((ostream *)&std::clog,"   p   dim b d \n");
  std::operator<<((ostream *)&std::clog,"where dim is the dimension of the homological feature,\n");
  std::operator<<((ostream *)&std::clog,
                  "b and d are respectively the birth and death of the feature and \n");
  poVar8 = std::operator<<((ostream *)&std::clog,
                           "p is the characteristic of the field Z/pZ used for homology coefficients."
                          );
  pvVar9 = (void *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<((ostream *)&std::clog,"Usage: ");
  poVar8 = std::operator<<(poVar8,*argv);
  poVar8 = std::operator<<(poVar8," [options] input-file");
  pvVar9 = (void *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  pvVar9 = (void *)boost::program_options::operator<<((ostream *)&std::clog,local_178);
  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  exit(-1);
}

Assistant:

void program_options(int argc, char* argv[], std::string& off_file_points, std::string& filediag,
                     Filtration_value& threshold, int& dim_max, int& p, Filtration_value& min_persistence) {
  namespace po = boost::program_options;
  po::options_description hidden("Hidden options");
  hidden.add_options()("input-file", po::value<std::string>(&off_file_points),
                       "Name of an OFF file containing a point set.\n");

  po::options_description visible("Allowed options", 100);
  visible.add_options()("help,h", "produce help message")(
      "output-file,o", po::value<std::string>(&filediag)->default_value(std::string()),
      "Name of file in which the persistence diagram is written. Default print in standard output")(
      "max-edge-length,r",
      po::value<Filtration_value>(&threshold)->default_value(std::numeric_limits<Filtration_value>::infinity()),
      "Maximal length of an edge for the Rips complex construction.")(
      "cpx-dimension,d", po::value<int>(&dim_max)->default_value(1),
      "Maximal dimension of the Rips complex we want to compute.")(
      "field-charac,p", po::value<int>(&p)->default_value(11),
      "Characteristic p of the coefficient field Z/pZ for computing homology.")(
      "min-persistence,m", po::value<Filtration_value>(&min_persistence),
      "Minimal lifetime of homology feature to be recorded. Default is 0. Enter a negative value to see zero length "
      "intervals");

  po::positional_options_description pos;
  pos.add("input-file", 1);

  po::options_description all;
  all.add(visible).add(hidden);

  po::variables_map vm;
  po::store(po::command_line_parser(argc, argv).options(all).positional(pos).run(), vm);
  po::notify(vm);

  if (vm.count("help") || !vm.count("input-file")) {
    std::clog << std::endl;
    std::clog << "Compute the persistent homology with coefficient field Z/pZ \n";
    std::clog << "of a Rips complex defined on a set of input points.\n \n";
    std::clog << "The output diagram contains one bar per line, written with the convention: \n";
    std::clog << "   p   dim b d \n";
    std::clog << "where dim is the dimension of the homological feature,\n";
    std::clog << "b and d are respectively the birth and death of the feature and \n";
    std::clog << "p is the characteristic of the field Z/pZ used for homology coefficients." << std::endl << std::endl;

    std::clog << "Usage: " << argv[0] << " [options] input-file" << std::endl << std::endl;
    std::clog << visible << std::endl;
    exit(-1);
  }
}